

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O0

int __thiscall KParser::_call(KParser *this,int begin,BlockInfo *bi)

{
  int iVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  __cxx11 local_230 [32];
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  BlockInfo local_178;
  int local_138;
  TokenType local_134;
  string local_130 [4];
  TokenType tokenValue;
  string rightValue;
  allocator local_109;
  int tryI;
  BlockInfo local_e8;
  __cxx11 local_a8 [32];
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  int local_30;
  int local_2c;
  int t;
  int i;
  BlockInfo *bi_local;
  KParser *pKStack_18;
  int begin_local;
  KParser *this_local;
  
  local_30 = 0;
  local_2c = begin;
  _t = bi;
  bi_local._4_4_ = begin;
  pKStack_18 = this;
  pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)begin);
  if (((pvVar2->tokenType == id) &&
      (pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                          (&this->m_tokens,(long)(local_2c + 1)), pvVar2->tokenType == lparen)) &&
     (pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (&this->m_tokens,(long)(local_2c + 2)), pvVar2->tokenType == rparen)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"call",&local_51);
    pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)local_2c);
    std::__cxx11::string::string(local_88,(string *)pvVar2);
    pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)local_2c);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->m_funcToParams,&pvVar2->str);
    std::__cxx11::to_string(local_a8,*pmVar3);
    addCode(this,(string *)local_50,(string *)local_88,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    this_local._4_4_ = local_2c + 3;
  }
  else {
    pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)local_2c);
    if ((pvVar2->tokenType == id) &&
       (pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (&this->m_tokens,(long)(local_2c + 1)), pvVar2->tokenType == lparen)) {
      iVar1 = local_2c + 2;
      local_2c = iVar1;
      BlockInfo::BlockInfo(&local_e8,bi);
      local_30 = _expr(this,iVar1,&local_e8);
      BlockInfo::~BlockInfo(&local_e8);
      iVar1 = local_2c;
      if (local_30 < 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&tryI,anon_var_dwarf_f122,&local_109);
        addErrorString(this,iVar1,(string *)&tryI);
        std::__cxx11::string::~string((string *)&tryI);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        this_local._4_4_ = -1;
      }
      else {
        local_2c = local_30;
        do {
          iVar1 = local_2c;
          pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                             (&this->m_tokens,(long)local_2c);
          std::__cxx11::string::string(local_130,(string *)pvVar2);
          pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                             (&this->m_tokens,(long)iVar1);
          local_134 = pvVar2->tokenType;
          if (local_134 == comma) {
            BlockInfo::BlockInfo(&local_178,bi);
            local_30 = _expr(this,iVar1 + 1,&local_178);
            BlockInfo::~BlockInfo(&local_178);
            iVar1 = local_2c;
            if (local_30 < 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_198,anon_var_dwarf_f12d,&local_199);
              addErrorString(this,iVar1,(string *)local_198);
              std::__cxx11::string::~string(local_198);
              std::allocator<char>::~allocator((allocator<char> *)&local_199);
              this_local._4_4_ = -1;
              local_138 = 1;
            }
            else {
              local_2c = local_30;
              local_138 = 0;
            }
          }
          else {
            local_138 = 3;
          }
          std::__cxx11::string::~string(local_130);
        } while (local_138 == 0);
        if (local_138 != 1) {
          pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                             (&this->m_tokens,(long)local_2c);
          iVar1 = local_2c;
          if (pvVar2->tokenType == rparen) {
            local_2c = local_2c + 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1e8,"call",&local_1e9);
            pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                               (&this->m_tokens,(long)bi_local._4_4_);
            std::__cxx11::string::string(local_210,(string *)pvVar2);
            pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                               (&this->m_tokens,(long)bi_local._4_4_);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->m_funcToParams,&pvVar2->str);
            std::__cxx11::to_string(local_230,*pmVar3);
            addCode(this,(string *)local_1e8,(string *)local_210,(string *)local_230);
            std::__cxx11::string::~string((string *)local_230);
            std::__cxx11::string::~string(local_210);
            std::__cxx11::string::~string(local_1e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
            this_local._4_4_ = local_2c;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1c0,anon_var_dwarf_f138,&local_1c1);
            addErrorString(this,iVar1,(string *)local_1c0);
            std::__cxx11::string::~string(local_1c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
            this_local._4_4_ = -1;
          }
        }
      }
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int KParser::_call(int begin,  BlockInfo bi) {
    // some();
    // some(a);
    // some(a,b,c);
    int i = begin;
    int t = 0;

    // 인자가 없는 경우 
    if (m_tokens[i].tokenType == TokenType::id && 
        m_tokens[i + 1].tokenType == TokenType::lparen && 
        m_tokens[i + 2].tokenType == TokenType::rparen
        ) {
        addCode("call", m_tokens[i].str,  std::to_string( m_funcToParams[m_tokens[i].str]));
        return i + 3;
    }

    // 인자가 하나이상 있는 경우
    if (m_tokens[i].tokenType == TokenType::id && 
        m_tokens[i + 1].tokenType == TokenType::lparen) {
        i = i + 2;
        // 이 까지 왔으면 매개변수가 하나이상 있는 것이다.
        t = _expr(i, bi);
        if (t < 0) {
            addErrorString(i, "함수 인자에는 표현식이 와야합니다.");
            return -1;
        }
        i = t;

        while (1) {
            int tryI = i;
            std::string rightValue = m_tokens[tryI].str;
            TokenType tokenValue = m_tokens[tryI].tokenType;
            if(tokenValue != TokenType::comma) {
                break;
            }
            tryI++;
            t = _expr(tryI, bi);
            if (t < 0) {
                addErrorString(i, ", 뒤에 표현식을 기대했습니다.");
                return -1; 
            }
            tryI = t;
            i = tryI;
        } 
        if (m_tokens[i].tokenType != TokenType::rparen) {
            addErrorString(i, "_call: ) 가 빠졌습니다.");
            return -1;
        }
        i++;
        addCode("call", m_tokens[begin].str,  std::to_string( m_funcToParams[m_tokens[begin].str]));
        return i;
    }

    return -1; 
}